

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckColorAvailable(TidyDocImpl *doc,Node *node)

{
  Dict *pDVar1;
  uint code;
  
  if (((0xfffffffc < (doc->access).PRIORITYCHK - 4U) && (pDVar1 = node->tag, pDVar1 != (Dict *)0x0))
     && ((code = 0x142, pDVar1->id == TidyTag_IMG ||
         ((pDVar1 != (Dict *)0x0 &&
          ((code = 0x143, pDVar1->id == TidyTag_APPLET ||
           ((pDVar1 != (Dict *)0x0 &&
            ((code = 0x144, pDVar1->id == TidyTag_OBJECT ||
             ((pDVar1 != (Dict *)0x0 &&
              ((code = 0x145, pDVar1->id == TidyTag_SCRIPT ||
               ((pDVar1 != (Dict *)0x0 && (code = 0x146, pDVar1->id == TidyTag_INPUT))))))))))))))))
        )) {
    prvTidyReportAccessWarning(doc,node,code);
    return;
  }
  return;
}

Assistant:

static void CheckColorAvailable( TidyDocImpl* doc, Node* node )
{
    if (Level1_Enabled( doc ))
    {
        if ( nodeIsIMG(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_IMAGE );

        else if ( nodeIsAPPLET(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_APPLET );

        else if ( nodeIsOBJECT(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_OBJECT );

        else if ( nodeIsSCRIPT(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_SCRIPT );

        else if ( nodeIsINPUT(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_INPUT );
    }
}